

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Frames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int fInitSpecial;
  int fNewAlgo;
  int nCofFanLit;
  int c;
  Gia_ParFra_t *pPars;
  Gia_ParFra_t Pars;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fInitSpecial = 0;
  bVar2 = false;
  bVar1 = false;
  Gia_ManFraSetDefaultParams((Gia_ParFra_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002a5760:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"FLsoibavh");
    if (iVar3 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Frames(): There is no AIG.\n");
        return 1;
      }
      iVar3 = Gia_ManRegNum(pAbc->pGia);
      if (iVar3 == 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      if (bVar1) {
        Pars._16_8_ = Gia_ManFramesInitSpecial(pAbc->pGia,(uint)pPars,Pars.fDisableSt);
      }
      else if (fInitSpecial == 0) {
        if (bVar2) {
          Pars._16_8_ = Gia_ManFrames2(pAbc->pGia,(Gia_ParFra_t *)&pPars);
        }
        else {
          Pars._16_8_ = Gia_ManFrames(pAbc->pGia,(Gia_ParFra_t *)&pPars);
        }
      }
      else {
        Pars._16_8_ = Gia_ManUnrollAndCofactor(pAbc->pGia,(uint)pPars,fInitSpecial,Pars.fDisableSt);
      }
      Abc_FrameUpdateGia(pAbc,(Gia_Man_t *)Pars._16_8_);
      return 0;
    }
    switch(iVar3) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002a59e3;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      uVar4 = (uint)pPars;
      break;
    default:
      goto LAB_002a59e3;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_002a59e3;
      }
      fInitSpecial = atoi(argv[globalUtilOptind]);
      uVar4 = fInitSpecial;
      break;
    case 0x61:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_002a5760;
    case 0x62:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002a5760;
    case 0x68:
      goto LAB_002a59e3;
    case 0x69:
      pPars._4_4_ = pPars._4_4_ ^ 1;
      goto LAB_002a5760;
    case 0x6f:
      Pars.fSaveLastLit = Pars.fSaveLastLit ^ 1;
      goto LAB_002a5760;
    case 0x73:
      Pars.fInit = Pars.fInit ^ 1;
      goto LAB_002a5760;
    case 0x76:
      Pars.fDisableSt = Pars.fDisableSt ^ 1;
      goto LAB_002a5760;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar4 < 0) {
LAB_002a59e3:
      Abc_Print(-2,"usage: &frames [-FL <num>] [-soibavh]\n");
      Abc_Print(-2,"\t         unrolls the design for several timeframes\n");
      Abc_Print(-2,"\t-F num : the number of frames to unroll [default = %d]\n",(ulong)(uint)pPars);
      Abc_Print(-2,
                "\t-L num : the limit on fanout count of resets/enables to cofactor [default = %d]\n"
                ,(ulong)(uint)fInitSpecial);
      pcVar5 = "no";
      if (Pars.fInit != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle disabling structural hashing [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (Pars.fSaveLastLit != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-o     : toggle ORing corresponding POs [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (pPars._4_4_ != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-i     : toggle initializing registers [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggle computing special AIG for BMC [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (bVar2) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle using new algorithm [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (Pars.fDisableSt != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Frames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFrames2( Gia_Man_t * pAig, Gia_ParFra_t * pPars );

    Gia_Man_t * pTemp;
    Gia_ParFra_t Pars, * pPars = &Pars;
    int c;
    int nCofFanLit = 0;
    int fNewAlgo = 0;
    int fInitSpecial = 0;
    Gia_ManFraSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FLsoibavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nCofFanLit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCofFanLit < 0 )
                goto usage;
            break;
        case 's':
            pPars->fDisableSt ^= 1;
            break;
        case 'o':
            pPars->fOrPos ^= 1;
            break;
        case 'i':
            pPars->fInit ^= 1;
            break;
        case 'b':
            fInitSpecial ^= 1;
            break;
        case 'a':
            fNewAlgo ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Frames(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( fInitSpecial )
        pTemp = Gia_ManFramesInitSpecial( pAbc->pGia, pPars->nFrames, pPars->fVerbose );
    else if ( nCofFanLit )
        pTemp = Gia_ManUnrollAndCofactor( pAbc->pGia, pPars->nFrames, nCofFanLit, pPars->fVerbose );
    else if ( fNewAlgo )
        pTemp = Gia_ManFrames2( pAbc->pGia, pPars );
    else
        pTemp = Gia_ManFrames( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &frames [-FL <num>] [-soibavh]\n" );
    Abc_Print( -2, "\t         unrolls the design for several timeframes\n" );
    Abc_Print( -2, "\t-F num : the number of frames to unroll [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-L num : the limit on fanout count of resets/enables to cofactor [default = %d]\n", nCofFanLit );
    Abc_Print( -2, "\t-s     : toggle disabling structural hashing [default = %s]\n", pPars->fDisableSt? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle ORing corresponding POs [default = %s]\n", pPars->fOrPos? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle initializing registers [default = %s]\n", pPars->fInit? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle computing special AIG for BMC [default = %s]\n", fInitSpecial? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle using new algorithm [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}